

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socksd.c
# Opt level: O3

curl_socket_t socksconnect(unsigned_short connectport,char *connectaddr)

{
  uint __errnum;
  int __fd;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  int iVar4;
  sockaddr local_88 [7];
  
  __fd = socket(2,1,0);
  iVar4 = -1;
  if (__fd != -1) {
    local_88[0].sa_data[6] = '\0';
    local_88[0].sa_data[7] = '\0';
    local_88[0].sa_data[8] = '\0';
    local_88[0].sa_data[9] = '\0';
    local_88[0].sa_data[10] = '\0';
    local_88[0].sa_data[0xb] = '\0';
    local_88[0].sa_data[0xc] = '\0';
    local_88[0].sa_data[0xd] = '\0';
    local_88[0].sa_family = 2;
    local_88[0].sa_data._0_2_ = connectport << 8 | connectport >> 8;
    local_88[0].sa_data[2] = '\0';
    local_88[0].sa_data[3] = '\0';
    local_88[0].sa_data[4] = '\0';
    local_88[0].sa_data[5] = '\0';
    inet_pton(2,config.addr,local_88[0].sa_data + 2);
    iVar1 = connect(__fd,local_88,0x10);
    if (iVar1 == 0) {
      logmsg("Connected fine to %s:%d",0x10a626,(ulong)connectport);
      iVar4 = __fd;
    }
    else {
      puVar2 = (uint *)__errno_location();
      __errnum = *puVar2;
      pcVar3 = strerror(__errnum);
      logmsg("Error connecting to %s:%hu: (%d) %s",0x10a626,(ulong)connectport,(ulong)__errnum,
             pcVar3);
    }
  }
  return iVar4;
}

Assistant:

static curl_socket_t socksconnect(unsigned short connectport,
                                  const char *connectaddr)
{
  int rc;
  srvr_sockaddr_union_t me;
  curl_socket_t sock = socket(AF_INET, SOCK_STREAM, 0);
  if(sock == CURL_SOCKET_BAD)
    return CURL_SOCKET_BAD;
  memset(&me.sa4, 0, sizeof(me.sa4));
  me.sa4.sin_family = AF_INET;
  me.sa4.sin_port = htons(connectport);
  me.sa4.sin_addr.s_addr = INADDR_ANY;
  Curl_inet_pton(AF_INET, connectaddr, &me.sa4.sin_addr);

  rc = connect(sock, &me.sa, sizeof(me.sa4));

  if(rc) {
    int error = SOCKERRNO;
    logmsg("Error connecting to %s:%hu: (%d) %s",
           connectaddr, connectport, error, strerror(error));
    return CURL_SOCKET_BAD;
  }
  logmsg("Connected fine to %s:%d", connectaddr, connectport);
  return sock;
}